

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTF2Exporter::GetTexSampler
          (glTF2Exporter *this,aiMaterial *mat,Ref<glTF2::Texture> texture,aiTextureType tt,
          uint slot)

{
  aiString *this_00;
  bool bVar1;
  aiReturn aVar2;
  char *pcVar3;
  element_type *peVar4;
  Texture *pTVar5;
  Sampler *pSVar6;
  Ref<glTF2::Sampler> RVar7;
  undefined1 local_8dc [8];
  aiString name;
  SamplerMinFilter filterMin;
  SamplerMagFilter filterMag;
  aiTextureMapMode mapV;
  aiTextureMapMode mapU;
  uint local_4c0;
  vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *local_4b8;
  uint local_4b0;
  string local_4a8;
  vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *local_488;
  uint local_480;
  vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *local_478;
  Ref<glTF2::Sampler> ref;
  undefined1 local_458 [8];
  string id;
  aiString aId;
  uint slot_local;
  aiTextureType tt_local;
  aiMaterial *mat_local;
  glTF2Exporter *this_local;
  Ref<glTF2::Texture> texture_local;
  
  this_local = (glTF2Exporter *)texture.vector;
  texture_local.vector._0_4_ = texture.index;
  this_00 = (aiString *)((long)&id.field_2 + 0xc);
  aiString::aiString(this_00);
  std::__cxx11::string::string((string *)local_458);
  aVar2 = aiGetMaterialString(mat,"$tex.mappingid",tt,slot,this_00);
  if (aVar2 == aiReturn_SUCCESS) {
    pcVar3 = aiString::C_Str((aiString *)((long)&id.field_2 + 0xc));
    std::__cxx11::string::operator=((string *)local_458,pcVar3);
  }
  peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  RVar7 = glTF2::LazyDict<glTF2::Sampler>::Get(&peVar4->samplers,pcVar3);
  local_488 = RVar7.vector;
  local_480 = RVar7.index;
  local_478 = local_488;
  ref.vector._0_4_ = local_480;
  bVar1 = glTF2::Ref::operator_cast_to_bool((Ref *)&local_478);
  if (bVar1) {
    pTVar5 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)&this_local);
    (pTVar5->sampler).vector = local_478;
    (pTVar5->sampler).index = (uint)ref.vector;
  }
  else {
    peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    glTF2::Asset::FindUniqueID(&local_4a8,peVar4,(string *)local_458,"sampler");
    std::__cxx11::string::operator=((string *)local_458,(string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    peVar4 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    RVar7 = glTF2::LazyDict<glTF2::Sampler>::Create(&peVar4->samplers,pcVar3);
    _mapV = RVar7.vector;
    local_4c0 = RVar7.index;
    local_4b8 = _mapV;
    local_4b0 = local_4c0;
    pTVar5 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)&this_local);
    (pTVar5->sampler).index = local_4b0;
    (pTVar5->sampler).vector = local_4b8;
    aVar2 = aiGetMaterialInteger(mat,"$tex.mapmodeu",tt,slot,(int *)&filterMag);
    if (aVar2 == aiReturn_SUCCESS) {
      pTVar5 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)&this_local);
      pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->(&pTVar5->sampler);
      SetSamplerWrap(&pSVar6->wrapS,filterMag);
    }
    aVar2 = aiGetMaterialInteger(mat,"$tex.mapmodev",tt,slot,(int *)&filterMin);
    if (aVar2 == aiReturn_SUCCESS) {
      pTVar5 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)&this_local);
      pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->(&pTVar5->sampler);
      SetSamplerWrap(&pSVar6->wrapT,filterMin);
    }
    aVar2 = aiGetMaterialInteger(mat,"$tex.mappingfiltermag",tt,slot,(int *)(name.data + 0x3fc));
    if (aVar2 == aiReturn_SUCCESS) {
      pTVar5 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)&this_local);
      pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->(&pTVar5->sampler);
      pSVar6->magFilter = name.data._1020_4_;
    }
    aVar2 = aiGetMaterialInteger(mat,"$tex.mappingfiltermin",tt,slot,(int *)(name.data + 0x3f8));
    if (aVar2 == aiReturn_SUCCESS) {
      pTVar5 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)&this_local);
      pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->(&pTVar5->sampler);
      pSVar6->minFilter = name.data._1016_4_;
    }
    aiString::aiString((aiString *)local_8dc);
    aVar2 = aiGetMaterialString(mat,"$tex.mappingname",tt,slot,(aiString *)local_8dc);
    if (aVar2 == aiReturn_SUCCESS) {
      pcVar3 = aiString::C_Str((aiString *)local_8dc);
      pTVar5 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)&this_local);
      pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->(&pTVar5->sampler);
      std::__cxx11::string::operator=((string *)&(pSVar6->super_Object).name,pcVar3);
    }
  }
  std::__cxx11::string::~string((string *)local_458);
  return;
}

Assistant:

void glTF2Exporter::GetTexSampler(const aiMaterial* mat, Ref<Texture> texture, aiTextureType tt, unsigned int slot)
{
    aiString aId;
    std::string id;
    if (aiGetMaterialString(mat, AI_MATKEY_GLTF_MAPPINGID(tt, slot), &aId) == AI_SUCCESS) {
        id = aId.C_Str();
    }

    if (Ref<Sampler> ref = mAsset->samplers.Get(id.c_str())) {
        texture->sampler = ref;
    } else {
        id = mAsset->FindUniqueID(id, "sampler");

        texture->sampler = mAsset->samplers.Create(id.c_str());

        aiTextureMapMode mapU, mapV;
        SamplerMagFilter filterMag;
        SamplerMinFilter filterMin;

        if (aiGetMaterialInteger(mat, AI_MATKEY_MAPPINGMODE_U(tt, slot), (int*)&mapU) == AI_SUCCESS) {
            SetSamplerWrap(texture->sampler->wrapS, mapU);
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_MAPPINGMODE_V(tt, slot), (int*)&mapV) == AI_SUCCESS) {
            SetSamplerWrap(texture->sampler->wrapT, mapV);
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_GLTF_MAPPINGFILTER_MAG(tt, slot), (int*)&filterMag) == AI_SUCCESS) {
            texture->sampler->magFilter = filterMag;
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_GLTF_MAPPINGFILTER_MIN(tt, slot), (int*)&filterMin) == AI_SUCCESS) {
            texture->sampler->minFilter = filterMin;
        }

        aiString name;
        if (aiGetMaterialString(mat, AI_MATKEY_GLTF_MAPPINGNAME(tt, slot), &name) == AI_SUCCESS) {
            texture->sampler->name = name.C_Str();
        }
    }
}